

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O2

void __thiscall CreditCard::performPayment(CreditCard *this)

{
  ostream *poVar1;
  double dVar2;
  long number;
  string expDate;
  long local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  string local_28 [32];
  
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  std::operator<<((ostream *)&std::cout,"Enter Credit Card Number (Without Space): ");
  std::istream::_M_extract<long>(&std::cin);
  std::operator<<((ostream *)&std::cout,"Enter Credit Expiry Date (Without Space) ");
  std::operator>>((istream *)&std::cin,(string *)&local_48);
  this->number = local_50;
  std::__cxx11::string::string(local_28,(string *)&local_48);
  std::__cxx11::string::_M_assign((string *)&this->expDate);
  std::__cxx11::string::~string(local_28);
  dVar2 = Payment::getAmount(&this->super_Payment);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1," is paid with credit card with ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," number");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CreditCard::performPayment() {
    long number;
    string expDate;

    cout << "Enter Credit Card Number (Without Space): ";
    cin >> number;
    cout << "Enter Credit Expiry Date (Without Space) ";
    cin >> expDate;
    setNumber(number);
    setExpDate(expDate);

    cout << getAmount() << " is paid with credit card with " << getNumber() << " number" << endl;
}